

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_util.cc
# Opt level: O3

bool libwebm::CopyMasteringMetadata(MasteringMetadata *parser_mm,MasteringMetadata *muxer_mm)

{
  float fVar1;
  bool bVar2;
  pointer *__ptr;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> white_point;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> local_48;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> local_40;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> local_38;
  _Head_base<0UL,_mkvmuxer::PrimaryChromaticity_*,_false> local_30;
  
  fVar1 = parser_mm->luminance_max;
  if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
    muxer_mm->luminance_max_ = fVar1;
  }
  fVar1 = parser_mm->luminance_min;
  if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
    muxer_mm->luminance_min_ = fVar1;
  }
  local_38._M_head_impl = (PrimaryChromaticity *)0x0;
  local_40._M_head_impl = (PrimaryChromaticity *)0x0;
  local_48._M_head_impl = (PrimaryChromaticity *)0x0;
  local_30._M_head_impl = (PrimaryChromaticity *)0x0;
  if (parser_mm->r != (PrimaryChromaticity *)0x0) {
    bVar2 = CopyPrimaryChromaticity(parser_mm->r,(PrimaryChromaticityPtr *)&local_38);
    if (bVar2) goto LAB_001573f2;
LAB_0015743f:
    bVar2 = false;
    goto LAB_00157477;
  }
LAB_001573f2:
  if (parser_mm->g != (PrimaryChromaticity *)0x0) {
    bVar2 = CopyPrimaryChromaticity(parser_mm->g,(PrimaryChromaticityPtr *)&local_40);
    if (!bVar2) goto LAB_0015743f;
  }
  if (parser_mm->b != (PrimaryChromaticity *)0x0) {
    bVar2 = CopyPrimaryChromaticity(parser_mm->b,(PrimaryChromaticityPtr *)&local_48);
    if (!bVar2) goto LAB_0015743f;
  }
  if (parser_mm->white_point == (PrimaryChromaticity *)0x0) {
    white_point._M_head_impl = (PrimaryChromaticity *)0x0;
LAB_00157446:
    bVar2 = mkvmuxer::MasteringMetadata::SetChromaticity
                      (muxer_mm,local_38._M_head_impl,local_40._M_head_impl,local_48._M_head_impl,
                       white_point._M_head_impl);
  }
  else {
    bVar2 = CopyPrimaryChromaticity(parser_mm->white_point,(PrimaryChromaticityPtr *)&local_30);
    white_point._M_head_impl = local_30._M_head_impl;
    if (bVar2) goto LAB_00157446;
    bVar2 = false;
  }
  if (white_point._M_head_impl != (PrimaryChromaticity *)0x0) {
    operator_delete(white_point._M_head_impl);
  }
LAB_00157477:
  if (local_48._M_head_impl != (PrimaryChromaticity *)0x0) {
    operator_delete(local_48._M_head_impl);
  }
  if (local_40._M_head_impl != (PrimaryChromaticity *)0x0) {
    operator_delete(local_40._M_head_impl);
  }
  if (local_38._M_head_impl != (PrimaryChromaticity *)0x0) {
    operator_delete(local_38._M_head_impl);
  }
  return bVar2;
}

Assistant:

bool CopyMasteringMetadata(const mkvparser::MasteringMetadata& parser_mm,
                           mkvmuxer::MasteringMetadata* muxer_mm) {
  if (MasteringMetadataValuePresent(parser_mm.luminance_max))
    muxer_mm->set_luminance_max(parser_mm.luminance_max);
  if (MasteringMetadataValuePresent(parser_mm.luminance_min))
    muxer_mm->set_luminance_min(parser_mm.luminance_min);

  PrimaryChromaticityPtr r_ptr(nullptr);
  PrimaryChromaticityPtr g_ptr(nullptr);
  PrimaryChromaticityPtr b_ptr(nullptr);
  PrimaryChromaticityPtr wp_ptr(nullptr);

  if (parser_mm.r) {
    if (!CopyPrimaryChromaticity(*parser_mm.r, &r_ptr))
      return false;
  }
  if (parser_mm.g) {
    if (!CopyPrimaryChromaticity(*parser_mm.g, &g_ptr))
      return false;
  }
  if (parser_mm.b) {
    if (!CopyPrimaryChromaticity(*parser_mm.b, &b_ptr))
      return false;
  }
  if (parser_mm.white_point) {
    if (!CopyPrimaryChromaticity(*parser_mm.white_point, &wp_ptr))
      return false;
  }

  if (!muxer_mm->SetChromaticity(r_ptr.get(), g_ptr.get(), b_ptr.get(),
                                 wp_ptr.get())) {
    return false;
  }

  return true;
}